

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O1

ostream * pstack::operator<<(ostream *os,
                            JSON<pstack::Field<char[8],_std::map<unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_char>
                            *o)

{
  ostream *poVar1;
  JSON<const_char_*,_char> local_38;
  char (*local_28) [8];
  char local_19;
  
  local_28 = o->object->k;
  local_38.context = &local_19;
  local_19 = '\0';
  local_38.object = (char **)&local_28;
  poVar1 = operator<<(os,&local_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
  print_container<std::map<unsigned_char,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,char,std::integral_constant<bool,true>,unsigned_char,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (poVar1,o->object->v,(int)*o->context);
  return poVar1;
}

Assistant:

std::ostream &
operator << (std::ostream &os, const JSON<Field<K,V>, C> &o)
{
   return os << json(o.object.k) << ":" << json(o.object.v, o.context);
}